

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O1

void miSubtractNonO1(QRegionPrivate *dest,QRect *r,QRect *rEnd,int y1,int y2)

{
  QList<QRect> *this;
  int iVar1;
  long lVar2;
  pointer pQVar3;
  
  this = &dest->rects;
  pQVar3 = QList<QRect>::data(this);
  if (r != rEnd) {
    pQVar3 = pQVar3 + dest->numRects;
    do {
      lVar2 = (dest->rects).d.size;
      if (lVar2 + -1 <= (long)dest->numRects) {
        QList<QRect>::resize(this,lVar2 * 2);
        pQVar3 = QList<QRect>::data(this);
        pQVar3 = pQVar3 + dest->numRects;
      }
      iVar1 = (r->x2).m_i;
      (pQVar3->x1).m_i = (r->x1).m_i;
      (pQVar3->y1).m_i = y1;
      (pQVar3->x2).m_i = iVar1;
      (pQVar3->y2).m_i = y2;
      dest->numRects = dest->numRects + 1;
      pQVar3 = pQVar3 + 1;
      r = r + 1;
    } while (r != rEnd);
  }
  return;
}

Assistant:

static void miSubtractNonO1(QRegionPrivate &dest, const QRect *r,
                            const QRect *rEnd, int y1, int y2)
{
    QRect *pNextRect;

    pNextRect = dest.rects.data() + dest.numRects;

    Q_ASSERT(y1<=y2);

    while (r != rEnd) {
        Q_ASSERT(r->left() <= r->right());
        MEMCHECK(dest, pNextRect, dest.rects)
        pNextRect->setCoords(r->left(), y1, r->right(), y2);
        ++dest.numRects;
        ++pNextRect;
        ++r;
    }
}